

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_to_lower_bound.hpp
# Opt level: O0

void burst::
     skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char,std::less<void>>
               (undefined8 range,undefined8 goal)

{
  type tVar1;
  char *goal_local;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *range_local;
  
  tVar1 = boost::algorithm::
          is_sorted<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::less<void>>
                    (range);
  if (!tVar1) {
    __assert_fail("boost::algorithm::is_sorted(range, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/range/skip_to_lower_bound.hpp"
                  ,0x18,
                  "void burst::skip_to_lower_bound(Range &, const Value &, Compare) [Range = boost::iterator_range<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>, Value = char, Compare = std::less<void>]"
                 );
  }
  detail::
  skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char,std::less<void>>
            (range,goal);
  return;
}

Assistant:

void skip_to_lower_bound (Range & range, const Value & goal, Compare compare)
    {
        BOOST_ASSERT(boost::algorithm::is_sorted(range, compare));
        detail::skip_to_lower_bound(range, goal, compare);
    }